

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::Serializer::CheckNeedSize(Serializer *this,uint32_t need_size)

{
  size_type sVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ulong __new_size;
  size_t cap;
  size_t size;
  uint32_t need_size_local;
  Serializer *this_local;
  
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(sVar1 - this->offset_);
  if (this_00 < (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)need_size) {
    sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::capacity
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
    __new_size = sVar1 - this->offset_;
    if (__new_size < need_size << 1) {
      sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::capacity
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_,
                 sVar1 + need_size * 10);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,__new_size);
  }
  return;
}

Assistant:

void Serializer::CheckNeedSize(uint32_t need_size) {
  size_t size = buffer_.size() - static_cast<size_t>(offset_);
  if (size < need_size) {
    size_t cap = buffer_.capacity() - static_cast<size_t>(offset_);
    if (cap < (need_size * 2)) {
      buffer_.reserve(buffer_.capacity() + (need_size * 10));
    }
    buffer_.resize(buffer_.size() + (need_size * 2));
  }
}